

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_XsimAnd(int Value0,int Value1)

{
  int Value1_local;
  int Value0_local;
  
  if ((Value0 == 1) || (Value1 == 1)) {
    Value1_local = 1;
  }
  else if ((Value0 == 3) || (Value1 == 3)) {
    Value1_local = 3;
  }
  else {
    if ((Value0 != 2) || (Value1 != 2)) {
      __assert_fail("Value0 == AU_VAL1 && Value1 == AU_VAL1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieNew.c"
                    ,0x4fb,"int Au_XsimAnd(int, int)");
    }
    Value1_local = 2;
  }
  return Value1_local;
}

Assistant:

static inline int  Au_XsimAnd( int Value0, int Value1 )   
{ 
    if ( Value0 == AU_VAL0 || Value1 == AU_VAL0 )
        return AU_VAL0;
    if ( Value0 == AU_VALX || Value1 == AU_VALX )
        return AU_VALX;
    assert( Value0 == AU_VAL1 && Value1 == AU_VAL1 );
    return AU_VAL1;
}